

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O3

void __thiscall xmrig::HttpApiRequest::done(HttpApiRequest *this,int status)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  uint *name;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  size_t sVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Value *rhs;
  Value result;
  Data local_c8;
  Data local_b8;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  (this->super_ApiRequest).m_state = STATE_DONE;
  iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xe])();
  if (iVar1 != 2) {
    (this->m_res).super_HttpResponse.m_statusCode = status;
    goto LAB_00151514;
  }
  iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xc])(this);
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)
               (CONCAT44(extraout_var,iVar1) + 0x10);
  (this->m_res).super_HttpResponse.m_statusCode = 200;
  if (status == 200) {
    iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
    name = (uint *)CONCAT44(extraout_var_00,iVar1);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_b8.s,(Ch *)name);
    if (local_b8.n.i64 == (Number)((ulong)*name * 0x20 + (*(ulong *)(name + 2) & 0xffffffffffff))) {
      local_c8.n.i64 = (Number)0x0;
      local_c8.s.str = (Ch *)0x3000000000000;
      local_60.s = "status";
      local_60.length = 6;
      local_70.s = "OK";
      local_70.length = 2;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,&local_60,&local_70,allocator);
      iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
      this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)CONCAT44(extraout_var_01,iVar1);
      local_b8.s.str = (Ch *)0x40500000018958f;
      local_b8.n.i64 = (Number)0x6;
      goto LAB_00151451;
    }
  }
  else {
    iVar1 = -0x7f59;
    if (status != 0x194) {
      iVar1 = status;
    }
    local_c8.n.i64 = (Number)0x0;
    local_c8.s.str = (Ch *)0x3000000000000;
    local_40.s = "code";
    local_40.length = 4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_c8.s,&local_40,iVar1,allocator);
    local_a0.s = "message";
    local_a0.length = 7;
    if (iVar1 < -0x7f59) {
      if (iVar1 == -0x7fbc) {
        local_50.s = "Parse error";
      }
      else if (iVar1 == -0x7f5a) {
        local_50.s = "Invalid params";
      }
      else {
LAB_001513dc:
        local_50.s = "Internal error";
      }
    }
    else if (iVar1 == -0x7f59) {
      local_50.s = "Method not found";
    }
    else {
      if (iVar1 != -0x7f58) goto LAB_001513dc;
      local_50.s = "Invalid Request";
    }
    sVar3 = strlen(local_50.s);
    local_50.length = (SizeType)sVar3;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,&local_a0,&local_50,allocator);
    iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
    this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_02,iVar1);
    local_b8.s.str = (Ch *)0x40500000018b2a1;
    local_b8.n.i64 = (Number)0x5;
LAB_00151451:
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,allocator);
  }
  iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
  local_80.s = "jsonrpc";
  local_80.length = 7;
  local_90.s = "2.0";
  local_90.length = 3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(extraout_var_03,iVar1),&local_80,&local_90,allocator);
  iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
  local_c8.n.i64 = (Number)0x0;
  local_c8.s.str = (Ch *)0x0;
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[7])(this);
  rhs = Json::getValue((Value *)CONCAT44(extraout_var_05,iVar2),"id");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_c8.s,rhs,allocator,false);
  local_b8.s.str = (Ch *)0x4050000001881a3;
  local_b8.n.i64 = (Number)0x2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(extraout_var_04,iVar1),
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,allocator);
LAB_00151514:
  HttpApiResponse::end(&this->m_res);
  return;
}

Assistant:

void xmrig::HttpApiRequest::done(int status)
{
    ApiRequest::done(status);

    if (type() == REQ_JSON_RPC) {
        using namespace rapidjson;
        auto &allocator = doc().GetAllocator();

        m_res.setStatus(HTTP_STATUS_OK);

        if (status != HTTP_STATUS_OK) {
            if (status == HTTP_STATUS_NOT_FOUND) {
                status = RPC_METHOD_NOT_FOUND;
            }

            Value error(kObjectType);
            error.AddMember("code",    status, allocator);
            error.AddMember("message", StringRef(rpcError(status)), allocator);

            reply().AddMember(StringRef(kError), error, allocator);
        }
        else if (!reply().HasMember(kResult)) {
            Value result(kObjectType);
            result.AddMember("status", "OK", allocator);

            reply().AddMember(StringRef(kResult), result, allocator);
        }

        reply().AddMember("jsonrpc", "2.0", allocator);
        reply().AddMember(StringRef(kId), Value().CopyFrom(Json::getValue(json(), kId), allocator), allocator);
    }
    else {
        m_res.setStatus(status);
    }

    m_res.end();
}